

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  int iVar3;
  ImGuiWindow *window_00;
  ImDrawList *pIVar4;
  ImDrawListSplitter *this;
  ImGuiContext *pIVar5;
  ImRect IVar6;
  ImRect IVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiCol idx;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  ImVec4 IVar13;
  ImU32 local_d8;
  ImGuiTableColumn *column_2;
  int column_n_1;
  float row_height;
  float y0;
  ImGuiTableColumn *column_1;
  int column_n;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [8];
  ImRect cell_bg_rect;
  ImGuiTableColumn *column;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *cell_data_end;
  ImRect row_rect;
  undefined8 local_48;
  bool draw_strong_bottom_border;
  ImU32 IStack_38;
  bool draw_cell_bg_color;
  float border_size;
  ImU32 border_col;
  ImU32 bg_col1;
  ImU32 bg_col0;
  bool is_visible;
  bool unfreeze_rows_request;
  bool unfreeze_rows_actual;
  float bg_y2;
  float bg_y1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  pIVar5 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (window_00 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x6b7,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if ((table->IsInsideRow & 1U) == 0) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x6b8,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if ((pIVar5->LogEnabled & 1U) != 0) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  (window_00->DC).CursorPos.y = table->RowPosY2;
  fVar12 = table->RowPosY1;
  fVar1 = table->RowPosY2;
  bVar9 = table->CurrentRow + 1 == (int)table->FreezeRowsCount;
  iVar3 = table->CurrentRow;
  cVar2 = table->FreezeRowsRequest;
  if (table->CurrentRow == 0) {
    table->LastFirstRowHeight = fVar1 - fVar12;
  }
  bVar10 = false;
  if ((table->InnerClipRect).Min.y <= fVar1) {
    bVar10 = fVar12 <= (table->InnerClipRect).Max.y;
  }
  if (bVar10) {
    border_col = 0;
    border_size = 0.0;
    if (table->RowBgColor[0] == 0x1000000) {
      if ((table->Flags & 0x40U) != 0) {
        idx = 0x2d;
        if ((table->RowBgColorCounter & 1U) != 0) {
          idx = 0x2e;
        }
        border_col = GetColorU32(idx,1.0);
      }
    }
    else {
      border_col = table->RowBgColor[0];
    }
    if (table->RowBgColor[1] != 0x1000000) {
      border_size = (float)table->RowBgColor[1];
    }
    IStack_38 = 0;
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       ((table->Flags & 0x80U) != 0)) {
      if ((*(int *)&table->field_0x98 >> 0x10 & 1U) == 0) {
        local_d8 = table->BorderColorLight;
      }
      else {
        local_d8 = table->BorderColorStrong;
      }
      IStack_38 = local_d8;
    }
    bVar10 = -1 < table->RowCellDataCurrent;
    if ((((border_col != 0 || border_size != 0.0) || IStack_38 != 0) || (bVar9)) || (bVar10)) {
      if ((table->Flags & 0x100000U) == 0) {
        IVar13 = ImRect::ToVec4(&table->Bg0ClipRectForDrawCmd);
        pIVar4 = window_00->DrawList;
        row_rect.Max = IVar13._0_8_;
        (pIVar4->_CmdHeader).ClipRect.x = row_rect.Max.x;
        (pIVar4->_CmdHeader).ClipRect.y = row_rect.Max.y;
        local_48 = IVar13._8_8_;
        (pIVar4->_CmdHeader).ClipRect.z = (float)(undefined4)local_48;
        (pIVar4->_CmdHeader).ClipRect.w = (float)local_48._4_4_;
        unique0x10000b7f = IVar13;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,window_00->DrawList,0);
    }
    if ((border_col != 0) || (border_size != 0.0)) {
      ImRect::ImRect((ImRect *)&cell_data_end,(table->WorkRect).Min.x,fVar12,(table->WorkRect).Max.x
                     ,fVar1);
      ImRect::ClipWith((ImRect *)&cell_data_end,&table->BgClipRect);
      if ((border_col != 0) && (cell_data_end._4_4_ < row_rect.Min.y)) {
        ImDrawList::AddRectFilled
                  (window_00->DrawList,(ImVec2 *)&cell_data_end,&row_rect.Min,border_col,0.0,0);
      }
      if ((border_size != 0.0) && (cell_data_end._4_4_ < row_rect.Min.y)) {
        ImDrawList::AddRectFilled
                  (window_00->DrawList,(ImVec2 *)&cell_data_end,&row_rect.Min,(ImU32)border_size,0.0
                   ,0);
      }
    }
    if (bVar10) {
      pIVar8 = (ImGuiTableColumn *)
               ImSpan<ImGuiTableCellData>::operator[]
                         (&table->RowCellData,(int)table->RowCellDataCurrent);
      for (column = (ImGuiTableColumn *)
                    ImSpan<ImGuiTableCellData>::operator[](&table->RowCellData,0); column <= pIVar8;
          column = (ImGuiTableColumn *)&column->MinX) {
        cell_bg_rect.Max =
             (ImVec2)ImSpan<ImGuiTableColumn>::operator[]
                               (&table->Columns,(int)*(char *)&column->WidthGiven);
        _local_88 = TableGetCellBgRect(table,(int)*(char *)&column->WidthGiven);
        ImRect::ClipWith((ImRect *)local_88,&table->BgClipRect);
        fVar11 = ImMax<float>((float)local_88._0_4_,*(float *)((long)cell_bg_rect.Max + 0x20));
        IVar6 = _local_88;
        local_88._0_4_ = fVar11;
        IVar7 = _local_88;
        cell_bg_rect.Min.x = IVar6.Max.x;
        fVar11 = cell_bg_rect.Min.x;
        _local_88 = IVar7;
        fVar11 = ImMin<float>(fVar11,*(float *)((long)cell_bg_rect.Max + 0xc));
        cell_bg_rect.Min.x = fVar11;
        ImDrawList::AddRectFilled
                  (window_00->DrawList,(ImVec2 *)local_88,&cell_bg_rect.Min,column->Flags,0.0,0);
      }
    }
    if (((IStack_38 != 0) && ((table->BgClipRect).Min.y <= fVar12)) &&
       (fVar12 < (table->BgClipRect).Max.y)) {
      pIVar4 = window_00->DrawList;
      ImVec2::ImVec2(&local_90,table->BorderX1,fVar12);
      ImVec2::ImVec2(&local_98,table->BorderX2,fVar12);
      ImDrawList::AddLine(pIVar4,&local_90,&local_98,IStack_38,1.0);
    }
    if (((bVar9) && ((table->BgClipRect).Min.y <= fVar1)) && (fVar1 < (table->BgClipRect).Max.y)) {
      pIVar4 = window_00->DrawList;
      ImVec2::ImVec2(&local_a0,table->BorderX1,fVar1);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff58,table->BorderX2,fVar1);
      ImDrawList::AddLine(pIVar4,&local_a0,(ImVec2 *)&stack0xffffffffffffff58,
                          table->BorderColorStrong,1.0);
    }
  }
  if (iVar3 + 1 == (int)cVar2) {
    for (column_1._4_4_ = 0; column_1._4_4_ < table->ColumnsCount;
        column_1._4_4_ = column_1._4_4_ + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_1._4_4_);
      pIVar8->NavLayerCurrent = column_1._4_4_ < table->FreezeColumnsCount;
    }
  }
  if (bVar9) {
    if ((table->IsUnfrozenRows & 1U) != 0) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x71b,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar12 = ImMax<float>(table->RowPosY2 + 1.0,(window_00->InnerClipRect).Min.y);
    fVar12 = ImMin<float>(fVar12,(window_00->InnerClipRect).Max.y);
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar12;
    (table->BgClipRect).Min.y = fVar12;
    fVar12 = (window_00->InnerClipRect).Max.y;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar12;
    (table->BgClipRect).Max.y = fVar12;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if ((table->Bg2ClipRectForDrawCmd).Max.y < (table->Bg2ClipRectForDrawCmd).Min.y) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x723,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar12 = table->RowPosY2;
    fVar1 = table->RowPosY1;
    fVar11 = ((table->WorkRect).Min.y + table->RowPosY2) - (table->OuterRect).Min.y;
    (window_00->DC).CursorPos.y = fVar11;
    table->RowPosY2 = fVar11;
    table->RowPosY1 = table->RowPosY2 - (fVar12 - fVar1);
    for (column_2._4_4_ = 0; column_2._4_4_ < table->ColumnsCount;
        column_2._4_4_ = column_2._4_4_ + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_2._4_4_);
      pIVar8->DrawChannelCurrent = pIVar8->DrawChannelUnfrozen;
      (pIVar8->ClipRect).Min.y = (table->Bg2ClipRectForDrawCmd).Min.y;
    }
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,0);
    SetWindowClipRectBeforeSetChannel(window_00,&pIVar8->ClipRect);
    this = table->DrawSplitter;
    pIVar4 = window_00->DrawList;
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,0);
    ImDrawListSplitter::SetCurrentChannel(this,pIVar4,(uint)pIVar8->DrawChannelCurrent);
  }
  if ((*(uint *)&table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}